

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O2

LOs __thiscall
Omega_h::form_new_conn(Omega_h *this,Dist *new_ents2old_owners,Dist *old_owners2new_uses)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LO LVar7;
  uint uVar8;
  void *extraout_RDX;
  undefined4 uVar9;
  long lVar10;
  int serv_use;
  long lVar11;
  ulong uVar12;
  LOs LVar13;
  Write<int> serv_uses2new_idxs;
  Write<int> local_2a8;
  Write<int> local_298;
  LOs old_owners2serv_ents;
  LOs old_owners2serv_uses;
  Read<int> serv_uses2ranks;
  Read<int> serv_ents2ranks;
  Write<int> local_248;
  Read<int> serv_ents2new_idxs;
  Write<int> local_228;
  Dist serv_uses2new_uses;
  Write<int> local_180;
  Write<int> local_170;
  Write<int> local_160;
  Write<int> local_150;
  Write<int> local_140;
  Write<int> local_130;
  type f;
  Dist old_owners2new_ents;
  
  LVar7 = Dist::nitems(new_ents2old_owners);
  std::__cxx11::string::string((string *)&old_owners2new_ents,"",(allocator *)&serv_uses2new_uses);
  Read<int>::Read((Read<int> *)&local_248,LVar7,0,1,(string *)&old_owners2new_ents);
  Dist::exch<int>((Dist *)&serv_ents2new_idxs,(Read<int> *)new_ents2old_owners,(Int)&local_248);
  Write<int>::~Write(&local_248);
  std::__cxx11::string::~string((string *)&old_owners2new_ents);
  Dist::invert(&old_owners2new_ents,new_ents2old_owners);
  Dist::items2ranks((Dist *)&serv_ents2ranks);
  Dist::items2ranks((Dist *)&serv_uses2ranks);
  LVar7 = Dist::nitems(old_owners2new_uses);
  Dist::roots2items((Dist *)&old_owners2serv_uses);
  Dist::roots2items((Dist *)&old_owners2serv_ents);
  uVar8 = Dist::nroots(&old_owners2new_ents);
  std::__cxx11::string::string((string *)&serv_uses2new_uses,"",(allocator *)&local_180);
  Write<int>::Write(&serv_uses2new_idxs,LVar7,(string *)&serv_uses2new_uses);
  std::__cxx11::string::~string((string *)&serv_uses2new_uses);
  Write<int>::Write((Write<int> *)&f,&old_owners2serv_ents.write_);
  Write<int>::Write(&f.old_owners2serv_uses.write_,&old_owners2serv_uses.write_);
  Write<int>::Write(&f.serv_uses2ranks.write_,&serv_uses2ranks.write_);
  Write<int>::Write(&f.serv_ents2ranks.write_,&serv_ents2ranks.write_);
  Write<int>::Write(&f.serv_ents2new_idxs.write_,&serv_ents2new_idxs.write_);
  Write<int>::Write(&f.serv_uses2new_idxs,&serv_uses2new_idxs);
  Write<int>::Write(&local_180,(Write<int> *)&f);
  Write<int>::Write(&local_170,&f.old_owners2serv_uses.write_);
  Write<int>::Write(&local_160,&f.serv_uses2ranks.write_);
  Write<int>::Write(&local_150,&f.serv_ents2ranks.write_);
  Write<int>::Write(&local_140,&f.serv_ents2new_idxs.write_);
  Write<int>::Write(&local_130,&f.serv_uses2new_idxs);
  if (0 < (int)uVar8) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&serv_uses2new_uses,&local_180);
    Write<int>::Write(&serv_uses2new_uses.roots2items_[0].write_,&local_170);
    Write<int>::Write(&serv_uses2new_uses.roots2items_[1].write_,&local_160);
    Write<int>::Write(&serv_uses2new_uses.items2content_[0].write_,&local_150);
    Write<int>::Write(&serv_uses2new_uses.items2content_[1].write_,&local_140);
    Write<int>::Write(&serv_uses2new_uses.msgs2content_[0].write_,&local_130);
    entering_parallel = 0;
    uVar12 = 0;
    while (uVar12 != uVar8) {
      iVar4 = *(int *)((long)&(serv_uses2new_uses.parent_comm_.
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar12 * 4);
      uVar1 = uVar12 + 1;
      iVar5 = *(int *)((long)&(serv_uses2new_uses.parent_comm_.
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar12 * 4 + 4);
      iVar6 = *(int *)((long)serv_uses2new_uses.roots2items_[0].write_.shared_alloc_.direct_ptr +
                      uVar12 * 4 + 4);
      for (lVar11 = (long)*(int *)((long)serv_uses2new_uses.roots2items_[0].write_.shared_alloc_.
                                         direct_ptr + uVar12 * 4); uVar12 = uVar1, lVar11 < iVar6;
          lVar11 = lVar11 + 1) {
        lVar10 = (long)iVar4;
        do {
          if (iVar5 <= lVar10) {
            uVar9 = 0xffffffff;
            goto LAB_002fd002;
          }
          lVar2 = lVar10 + 1;
          lVar3 = lVar10 * 4;
          lVar10 = lVar2;
        } while (*(int *)((long)serv_uses2new_uses.items2content_[0].write_.shared_alloc_.direct_ptr
                         + lVar3) !=
                 *(int *)((long)serv_uses2new_uses.roots2items_[1].write_.shared_alloc_.direct_ptr +
                         lVar11 * 4));
        uVar9 = *(undefined4 *)
                 ((long)serv_uses2new_uses.items2content_[1].write_.shared_alloc_.direct_ptr +
                 lVar2 * 4 + -4);
LAB_002fd002:
        *(undefined4 *)
         ((long)serv_uses2new_uses.msgs2content_[0].write_.shared_alloc_.direct_ptr + lVar11 * 4) =
             uVar9;
      }
    }
    form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&serv_uses2new_uses);
  }
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&local_180);
  Dist::Dist(&serv_uses2new_uses,old_owners2new_uses);
  local_228.shared_alloc_.alloc = (Alloc *)0x0;
  local_228.shared_alloc_.direct_ptr = (void *)0x0;
  Dist::set_roots2items(&serv_uses2new_uses,(LOs *)&local_228);
  Write<int>::~Write(&local_228);
  Write<int>::Write(&local_2a8,&serv_uses2new_idxs);
  Read<int>::Read((Read<signed_char> *)&local_298,&local_2a8);
  Dist::exch<int>((Dist *)this,(Read<int> *)&serv_uses2new_uses,(Int)&local_298);
  Write<int>::~Write(&local_298);
  Write<int>::~Write(&local_2a8);
  Dist::~Dist(&serv_uses2new_uses);
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&serv_uses2new_idxs);
  Write<int>::~Write(&old_owners2serv_ents.write_);
  Write<int>::~Write(&old_owners2serv_uses.write_);
  Write<int>::~Write(&serv_uses2ranks.write_);
  Write<int>::~Write(&serv_ents2ranks.write_);
  Dist::~Dist(&old_owners2new_ents);
  Write<int>::~Write(&serv_ents2new_idxs.write_);
  LVar13.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar13.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar13.write_.shared_alloc_;
}

Assistant:

LOs form_new_conn(Dist new_ents2old_owners, Dist old_owners2new_uses) {
  auto nnew_ents = new_ents2old_owners.nitems();
  auto serv_ents2new_idxs = new_ents2old_owners.exch(LOs(nnew_ents, 0, 1), 1);
  auto old_owners2new_ents = new_ents2old_owners.invert();
  auto serv_ents2ranks = old_owners2new_ents.items2ranks();
  auto serv_uses2ranks = old_owners2new_uses.items2ranks();
  auto nserv_uses = old_owners2new_uses.nitems();
  auto old_owners2serv_uses = old_owners2new_uses.roots2items();
  auto old_owners2serv_ents = old_owners2new_ents.roots2items();
  auto nold_owners = old_owners2new_ents.nroots();
  Write<LO> serv_uses2new_idxs(nserv_uses);
  auto f = OMEGA_H_LAMBDA(LO old_owner) {
    auto ebegin = old_owners2serv_ents[old_owner];
    auto eend = old_owners2serv_ents[old_owner + 1];
    auto ubegin = old_owners2serv_uses[old_owner];
    auto uend = old_owners2serv_uses[old_owner + 1];
    for (auto serv_use = ubegin; serv_use < uend; ++serv_use) {
      auto rank = serv_uses2ranks[serv_use];
      LO idx = -1;
      for (auto e = ebegin; e < eend; ++e) {
        if (serv_ents2ranks[e] == rank) {
          idx = serv_ents2new_idxs[e];
          break;
        }
      }
      serv_uses2new_idxs[serv_use] = idx;
    }
  };
  parallel_for(nold_owners, f, "form_new_conn");
  auto serv_uses2new_uses = old_owners2new_uses;
  serv_uses2new_uses.set_roots2items(LOs());
  return serv_uses2new_uses.exch(LOs(serv_uses2new_idxs), 1);
}